

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int erkStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  int in_EDX;
  FILE *in_RSI;
  ARKodeMem in_RDI;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeERKStepMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    if (in_EDX == 0) {
      fprintf(in_RSI,"RHS fn evals                 = %ld\n",in_stack_ffffffffffffffd8->Sabstol);
    }
    else {
      if (in_EDX != 1) {
        arkProcessError(in_RDI,-0x16,0x18d,"erkStep_PrintAllStats",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep_io.c"
                        ,"Invalid formatting option.");
        return -0x16;
      }
      fprintf(in_RSI,",RHS fn evals,%ld",in_stack_ffffffffffffffd8->Sabstol);
      fprintf(in_RSI,"\n");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int erkStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile, SUNOutputFormat fmt)
{
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  switch (fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    fprintf(outfile, "RHS fn evals                 = %ld\n", step_mem->nfe);
    break;
  case SUN_OUTPUTFORMAT_CSV:
    fprintf(outfile, ",RHS fn evals,%ld", step_mem->nfe);
    fprintf(outfile, "\n");
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid formatting option.");
    return (ARK_ILL_INPUT);
  }

  return (ARK_SUCCESS);
}